

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

QTextList * __thiscall QTextCursor::createList(QTextCursor *this,QTextListFormat *format)

{
  QTextCursorPrivate *pQVar1;
  int o;
  QTextObject *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
    }
    pQVar1 = (this->d).d.ptr;
    if (pQVar1->priv != (QTextDocumentPrivate *)0x0) {
      if ((pQVar1 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      this_00 = QTextDocumentPrivate::createObject
                          (((this->d).d.ptr)->priv,&format->super_QTextFormat,-1);
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)local_38);
      o = QTextObject::objectIndex(this_00);
      QTextFormat::setObjectIndex((QTextFormat *)local_38,o);
      mergeBlockFormat(this,(QTextBlockFormat *)local_38);
      QTextFormat::~QTextFormat((QTextFormat *)local_38);
      goto LAB_004c77e9;
    }
  }
  this_00 = (QTextObject *)0x0;
LAB_004c77e9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QTextList *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QTextList *QTextCursor::createList(const QTextListFormat &format)
{
    if (!d || !d->priv)
        return nullptr;

    QTextList *list = static_cast<QTextList *>(d->priv->createObject(format));
    QTextBlockFormat modifier;
    modifier.setObjectIndex(list->objectIndex());
    mergeBlockFormat(modifier);
    return list;
}